

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  int iVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  if ((uint)size == 0 || (window->SetWindowSizeAllowFlags & (uint)size) != 0) {
    window->SetWindowSizeAllowFlags = window->SetWindowSizeAllowFlags & 0xfffffff1;
    if (in_XMM0_Da <= 0.0) {
      window->AutoFitOnlyGrows = false;
      iVar1 = 2;
    }
    else {
      (window->SizeFull).x = (float)(int)in_XMM0_Da;
      iVar1 = 0;
    }
    window->AutoFitFramesX = iVar1;
    if (0.0 < in_XMM1_Da) {
      window->AutoFitFramesY = 0;
      (window->SizeFull).y = (float)(int)in_XMM1_Da;
      return;
    }
    window->AutoFitFramesY = 2;
    window->AutoFitOnlyGrows = false;
  }
  return;
}

Assistant:

static void SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = ImFloor(size.x);
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = ImFloor(size.y);
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}